

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTableWidgetSelectionRange>::relocate
          (QArrayDataPointer<QTableWidgetSelectionRange> *this,qsizetype offset,
          QTableWidgetSelectionRange **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTableWidgetSelectionRange> *in_RDI;
  QTableWidgetSelectionRange **unaff_retaddr;
  QTableWidgetSelectionRange *res;
  QTableWidgetSelectionRange *first;
  QArrayDataPointer<QTableWidgetSelectionRange> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QTableWidgetSelectionRange,long_long>
            (first,(longlong)in_RDI,(QTableWidgetSelectionRange *)0x8ed437);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QTableWidgetSelectionRange>,QTableWidgetSelectionRange_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }